

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,string *base58_data,ByteData256 *tweak_sum)

{
  ByteData local_60;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ByteData256 *tweak_sum_local;
  string *base58_data_local;
  ExtPrivkey *this_local;
  
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  AnalyzeBip32KeyData((void *)0x0,base58_data,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
                      &this->version_,&this->depth_,&this->child_num_,&this->chaincode_,
                      &this->privkey_,(Pubkey *)0x0,&this->fingerprint_);
  ByteData::ByteData(&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  ByteData::operator=(&this->serialize_data_,&local_60);
  ByteData::~ByteData(&local_60);
  ByteData256::operator=(&this->tweak_sum_,tweak_sum);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    const std::string& base58_data, const ByteData256& tweak_sum) {
  std::vector<uint8_t> data;
  AnalyzeBip32KeyData(
      nullptr, &base58_data, &data, &version_, &depth_, &child_num_,
      &chaincode_, &privkey_, nullptr, &fingerprint_);
  serialize_data_ = ByteData(data);
  tweak_sum_ = tweak_sum;
}